

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void d68020_cpbcc_16(m68k_info *info)

{
  uint value;
  int displacement;
  m68k_info *info_00;
  m68k_info *in_RDI;
  cs_m68k *ext;
  cs_m68k_op *op0;
  undefined8 in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  m68k_info *in_stack_fffffffffffffff0;
  
  if ((in_RDI->type & 0x1c) == 0) {
    d68000_invalid((m68k_info *)0x39ec23);
  }
  else {
    in_RDI->inst->Opcode = (in_RDI->ir & 0x2f) + in_RDI->inst->Opcode;
    info_00 = (m68k_info *)
              build_init_op(in_stack_fffffffffffffff0,
                            (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
                            (int)in_stack_ffffffffffffffe8,
                            (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
    value = read_imm_16(info_00);
    displacement = make_int_16(value);
    make_cpbcc_operand((cs_m68k_op *)info_00,2,displacement);
    set_insn_group(in_RDI,M68K_GRP_JUMP);
    set_insn_group(in_RDI,M68K_GRP_BRANCH_RELATIVE);
  }
  return;
}

Assistant:

static void d68020_cpbcc_16(m68k_info *info)
{
	cs_m68k_op* op0;
	cs_m68k* ext;
	LIMIT_CPU_TYPES(info, M68020_PLUS);

	// these are all in row with the extension so just doing a add here is fine
	info->inst->Opcode += (info->ir & 0x2f);

	ext = build_init_op(info, M68K_INS_FBF, 1, 2);
	op0 = &ext->operands[0];

	make_cpbcc_operand(op0, M68K_OP_BR_DISP_SIZE_WORD, make_int_16(read_imm_16(info)));
	
	set_insn_group(info, M68K_GRP_JUMP);
	set_insn_group(info, M68K_GRP_BRANCH_RELATIVE);
}